

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsClient.cpp
# Opt level: O3

string * __thiscall xs::parseString_abi_cxx11_(string *__return_storage_ptr__,xs *this,char *str)

{
  xs xVar1;
  xs xVar2;
  size_t sVar3;
  char endChar;
  xs *pxVar4;
  ostringstream o;
  xs local_1a1;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  xVar1 = *this;
  if ((xVar1 == (xs)0x27) || (xVar1 == (xs)0x22)) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    xVar2 = this[1];
    if (xVar2 != (xs)0x0 && xVar2 != xVar1) {
      pxVar4 = this + 1;
      do {
        if (xVar2 == (xs)0x5c) {
          xVar2 = pxVar4[1];
          if (xVar2 != (xs)0x0) {
            if (xVar2 == (xs)0x74) {
              local_1a1 = (xs)0x9;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a0,(char *)&local_1a1,1);
            }
            else if (xVar2 == (xs)0x6e) {
              local_1a1 = (xs)0xa;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a0,(char *)&local_1a1,1);
            }
            else {
              local_1a1 = xVar2;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a0,(char *)&local_1a1,1);
            }
          }
          pxVar4 = pxVar4 + 2;
        }
        else {
          local_1a1 = xVar2;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a0,(char *)&local_1a1,1);
          pxVar4 = pxVar4 + 1;
        }
        xVar2 = *pxVar4;
      } while ((xVar2 != xVar1) && (xVar2 != (xs)0x0));
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
    std::ios_base::~ios_base(local_130);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar3 = strlen((char *)this);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,this,this + sVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

string parseString (const char* str)
{
	if (str[0] == '\'' || str[0] == '"')
	{
		const char*			p		= str;
		char				endChar = *p++;
		std::ostringstream	o;

		while (*p != endChar && *p)
		{
			if (*p == '\\')
			{
				switch (p[1])
				{
					case 0:		DE_ASSERT(DE_FALSE);	break;
					case 'n':	o << '\n';				break;
					case 't':	o << '\t';				break;
					default:	o << p[1];				break;
				}

				p += 2;
			}
			else
				o << *p++;
		}

		return o.str();
	}
	else
		return string(str);
}